

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O0

uint8_t * apx_attributeParser_parse_port_attributes
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_portAttributes_t *attr)

{
  uint8_t *pBegin;
  uint8_t *result;
  uint8_t *next;
  apx_portAttributes_t *attr_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  apx_attributeParser_t *self_local;
  
  if (((end < begin) || (begin == (uint8_t *)0x0)) || (result = begin, end == (uint8_t *)0x0)) {
    apx_attributeParser_set_error(self,1,(uint8_t *)0x0);
    self_local = (apx_attributeParser_t *)0x0;
  }
  else {
    while( true ) {
      if (((end <= result) || (result = bstr_lstrip(result,end), result == end)) ||
         ((pBegin = apx_attributeParser_parse_single_port_attribute(self,result,end,attr),
          pBegin <= result || (result = bstr_lstrip(pBegin,end), result == end))))
      goto LAB_00126cd3;
      if (*result != ',') break;
      result = result + 1;
    }
    apx_attributeParser_set_error(self,3,result);
    result = (uint8_t *)0x0;
LAB_00126cd3:
    self_local = (apx_attributeParser_t *)result;
  }
  return (uint8_t *)self_local;
}

Assistant:

uint8_t const* apx_attributeParser_parse_port_attributes(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_portAttributes_t* attr)
{
   uint8_t const* next = begin;
   if ((end < begin) || (begin == NULL) || (end == NULL))
   {
      apx_attributeParser_set_error(self, APX_INVALID_ARGUMENT_ERROR, NULL);
      return NULL;
   }
   while (next < end)
   {
      next = bstr_lstrip(next, end);
      if (next == end)
      {
         break;
      }
      uint8_t const* result = apx_attributeParser_parse_single_port_attribute(self, next, end, attr);
      if (result > next)
      {
         next = bstr_lstrip(result, end);
         if (next == end)
         {
            break;
         }
         if (*next == ',')
         {
            next++;
         }
         else
         {
            apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
            next = NULL;
            break;
         }
      }
      else
      {
         break;
      }
   }
   return next;

}